

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.h
# Opt level: O0

ReorganizeDataLayerParams * __thiscall
CoreML::Specification::NeuralNetworkLayer::mutable_reorganizedata(NeuralNetworkLayer *this)

{
  bool bVar1;
  ReorganizeDataLayerParams *this_00;
  NeuralNetworkLayer *this_local;
  
  bVar1 = has_reorganizedata(this);
  if (!bVar1) {
    clear_layer(this);
    set_has_reorganizedata(this);
    this_00 = (ReorganizeDataLayerParams *)operator_new(0x20);
    ReorganizeDataLayerParams::ReorganizeDataLayerParams(this_00);
    (this->layer_).reorganizedata_ = this_00;
  }
  return (ReorganizeDataLayerParams *)(this->layer_).convolution_;
}

Assistant:

inline ::CoreML::Specification::ReorganizeDataLayerParams* NeuralNetworkLayer::mutable_reorganizedata() {
  if (!has_reorganizedata()) {
    clear_layer();
    set_has_reorganizedata();
    layer_.reorganizedata_ = new ::CoreML::Specification::ReorganizeDataLayerParams;
  }
  // @@protoc_insertion_point(field_mutable:CoreML.Specification.NeuralNetworkLayer.reorganizeData)
  return layer_.reorganizedata_;
}